

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codim_mesh_data_set.h
# Opt level: O3

Matrix<float,_3,_1,_0,_3,_1> * __thiscall
lf::mesh::utils::CodimMeshDataSet<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator()
          (CodimMeshDataSet<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *this,Entity *e)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  element_type *peVar3;
  int iVar4;
  uint uVar5;
  stringstream ss;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  iVar4 = (*(this->super_MeshDataSet<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>)._vptr_MeshDataSet[1])();
  if ((char)iVar4 == '\0') {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198,"MeshDataSet not defined on this entity.",0x27);
    paVar1 = &local_1e8.field_2;
    local_1e8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"DefinedOn(e)","");
    paVar2 = &local_208.field_2;
    local_208._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/codim_mesh_data_set.h"
               ,"");
    std::__cxx11::stringbuf::str();
    lf::base::AssertionFailed(&local_1e8,&local_208,0x4b,&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    local_1e8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"false","");
    local_208._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/codim_mesh_data_set.h"
               ,"");
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"");
    lf::base::AssertionFailed(&local_1e8,&local_208,0x4b,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1e8);
    abort();
  }
  peVar3 = (this->mesh_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  uVar5 = (*peVar3->_vptr_Mesh[5])(peVar3,e);
  if ((ulong)uVar5 < (this->data_).m_holder.m_size) {
    return (this->data_).m_holder.m_start + uVar5;
  }
  boost::assertion_failed
            ("this->m_holder.m_size > n",
             "const_reference boost::container::vector<Eigen::Matrix<float, 3, 1>>::operator[](size_type) const [T = Eigen::Matrix<float, 3, 1>, A = void, Options = void]"
             ,
             "/root/.hunter/_Base/7456937/c3d17be/2b93a9d/Install/include/boost/container/vector.hpp"
             ,0x6da);
}

Assistant:

[[nodiscard]] const T& operator()(const Entity& e) const override {
    LF_ASSERT_MSG(DefinedOn(e), "MeshDataSet not defined on this entity.");
    return data_[mesh_->Index(e)];
  }